

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  char *pcVar5;
  internal *piVar6;
  TestPartResult *this;
  int width;
  int width_00;
  int width_01;
  int width_02;
  TimeInMillis ms;
  string local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  undefined1 local_388 [8];
  string message;
  string location;
  TestPartResult *part;
  int i;
  int failures;
  allocator local_311;
  string local_310;
  allocator local_2e9;
  string local_2e8;
  string local_2c8;
  allocator local_2a1;
  string local_2a0;
  allocator local_279;
  string local_278;
  allocator local_251;
  string local_250;
  undefined4 local_22c;
  string local_228;
  allocator local_201;
  string local_200;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  string local_a0;
  undefined1 local_80 [8];
  string kIndent;
  allocator local_49;
  undefined1 local_48 [8];
  string kTestcase;
  TestResult *result;
  TestInfo *test_info_local;
  char *test_case_name_local;
  ostream *stream_local;
  
  kTestcase.field_2._8_8_ = TestInfo::result(test_info);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,"testcase",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  Indent_abi_cxx11_((string *)local_80,(internal *)0xa,width);
  Indent_abi_cxx11_(&local_a0,(internal *)0x8,width_00);
  poVar4 = std::operator<<(stream,(string *)&local_a0);
  std::operator<<(poVar4,"{\n");
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"name",&local_c1);
  pcVar5 = TestInfo::name(test_info);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,pcVar5,&local_e9);
  OutputJsonKey(stream,(string *)local_48,&local_c0,&local_e8,(string *)local_80,true);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  pcVar5 = TestInfo::value_param(test_info);
  if (pcVar5 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,"value_param",&local_111);
    pcVar5 = TestInfo::value_param(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,pcVar5,&local_139);
    OutputJsonKey(stream,(string *)local_48,&local_110,&local_138,(string *)local_80,true);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
  }
  pcVar5 = TestInfo::type_param(test_info);
  if (pcVar5 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,"type_param",&local_161);
    pcVar5 = TestInfo::type_param(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_188,pcVar5,&local_189);
    OutputJsonKey(stream,(string *)local_48,&local_160,&local_188,(string *)local_80,true);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
  }
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_250,"status",&local_251);
    bVar1 = TestInfo::should_run(test_info);
    pcVar5 = "NOTRUN";
    if (bVar1) {
      pcVar5 = "RUN";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_278,pcVar5,&local_279);
    OutputJsonKey(stream,(string *)local_48,&local_250,&local_278,(string *)local_80,true);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a0,"time",&local_2a1);
    piVar6 = (internal *)TestResult::elapsed_time((TestResult *)kTestcase.field_2._8_8_);
    FormatTimeInMillisAsDuration_abi_cxx11_(&local_2c8,piVar6,ms);
    OutputJsonKey(stream,(string *)local_48,&local_2a0,&local_2c8,(string *)local_80,true);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e8,"classname",&local_2e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_310,test_case_name,&local_311);
    OutputJsonKey(stream,(string *)local_48,&local_2e8,&local_310,(string *)local_80,false);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator((allocator<char> *)&local_311);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    TestPropertiesAsJson((string *)&i,(TestResult *)kTestcase.field_2._8_8_,(string *)local_80);
    std::operator<<(stream,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    part._4_4_ = 0;
    for (part._0_4_ = 0; iVar2 = TestResult::total_part_count((TestResult *)kTestcase.field_2._8_8_)
        , (int)part < iVar2; part._0_4_ = (int)part + 1) {
      this = TestResult::GetTestPartResult((TestResult *)kTestcase.field_2._8_8_,(int)part);
      bVar1 = TestPartResult::failed(this);
      if (bVar1) {
        std::operator<<(stream,",\n");
        part._4_4_ = part._4_4_ + 1;
        if (part._4_4_ == 1) {
          poVar4 = std::operator<<(stream,(string *)local_80);
          poVar4 = std::operator<<(poVar4,"\"");
          poVar4 = std::operator<<(poVar4,"failures");
          std::operator<<(poVar4,"\": [\n");
        }
        piVar6 = (internal *)TestPartResult::file_name(this);
        uVar3 = TestPartResult::line_number(this);
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  ((string *)((long)&message.field_2 + 8),piVar6,(char *)(ulong)uVar3,iVar2);
        std::operator+(&local_3c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&message.field_2 + 8),"\n");
        pcVar5 = TestPartResult::message(this);
        std::operator+(&local_3a8,&local_3c8,pcVar5);
        EscapeJson((string *)local_388,&local_3a8);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_3c8);
        poVar4 = std::operator<<(stream,(string *)local_80);
        poVar4 = std::operator<<(poVar4,"  {\n");
        poVar4 = std::operator<<(poVar4,(string *)local_80);
        poVar4 = std::operator<<(poVar4,"    \"failure\": \"");
        poVar4 = std::operator<<(poVar4,(string *)local_388);
        poVar4 = std::operator<<(poVar4,"\",\n");
        poVar4 = std::operator<<(poVar4,(string *)local_80);
        poVar4 = std::operator<<(poVar4,"    \"type\": \"\"\n");
        poVar4 = std::operator<<(poVar4,(string *)local_80);
        std::operator<<(poVar4,"  }");
        std::__cxx11::string::~string((string *)local_388);
        std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
      }
    }
    if (0 < part._4_4_) {
      poVar4 = std::operator<<(stream,"\n");
      poVar4 = std::operator<<(poVar4,(string *)local_80);
      std::operator<<(poVar4,"]");
    }
    poVar4 = std::operator<<(stream,"\n");
    Indent_abi_cxx11_(&local_3e8,(internal *)0x8,width_02);
    poVar4 = std::operator<<(poVar4,(string *)&local_3e8);
    std::operator<<(poVar4,"}");
    std::__cxx11::string::~string((string *)&local_3e8);
    local_22c = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b0,"file",&local_1b1);
    pcVar5 = TestInfo::file(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d8,pcVar5,&local_1d9);
    OutputJsonKey(stream,(string *)local_48,&local_1b0,&local_1d8,(string *)local_80,true);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_200,"line",&local_201);
    iVar2 = TestInfo::line(test_info);
    OutputJsonKey(stream,(string *)local_48,&local_200,iVar2,(string *)local_80,false);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    poVar4 = std::operator<<(stream,"\n");
    Indent_abi_cxx11_(&local_228,(internal *)0x8,width_01);
    poVar4 = std::operator<<(poVar4,(string *)&local_228);
    std::operator<<(poVar4,"}");
    std::__cxx11::string::~string((string *)&local_228);
    local_22c = 1;
  }
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_case_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestcase, "name", test_info.name(), kIndent);

  if (test_info.value_param() != NULL) {
    OutputJsonKey(stream, kTestcase, "value_param",
                  test_info.value_param(), kIndent);
  }
  if (test_info.type_param() != NULL) {
    OutputJsonKey(stream, kTestcase, "type_param", test_info.type_param(),
                  kIndent);
  }
  if (GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, kTestcase, "file", test_info.file(), kIndent);
    OutputJsonKey(stream, kTestcase, "line", test_info.line(), kIndent, false);
    *stream << "\n" << Indent(8) << "}";
    return;
  }

  OutputJsonKey(stream, kTestcase, "status",
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestcase, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestcase, "classname", test_case_name, kIndent, false);
  *stream << TestPropertiesAsJson(result, kIndent);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}